

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_slay_code(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  slay *slay;
  slay *h;
  char *code;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"code");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x40);
  v[7] = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  *v = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_slay_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct slay *h = parser_priv(p);
	struct slay *slay = mem_zalloc(sizeof *slay);

	slay->next = h;
	parser_setpriv(p, slay);
	slay->code = string_make(code);
	return PARSE_ERROR_NONE;
}